

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void R_InterpolateView(player_t *player,double Frac,InterpolationViewer *iview)

{
  DVector3a *pDVar1;
  double *pdVar2;
  int iVar3;
  FSectorPortal *pFVar4;
  int iVar5;
  subsector_t *psVar6;
  DVector3a *pDVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_98;
  double local_90;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  
  if (NoInterpolateView) {
    if (InterpolationPath.Count != 0) {
      InterpolationPath.Count = 0;
    }
    NoInterpolateView = false;
    (iview->Old).Pos.Z = (iview->New).Pos.Z;
    dVar14 = (iview->New).Pos.Y;
    (iview->Old).Pos.X = (iview->New).Pos.X;
    (iview->Old).Pos.Y = dVar14;
    (iview->Old).Angles.Roll.Degrees = (iview->New).Angles.Roll.Degrees;
    dVar14 = (iview->New).Angles.Yaw.Degrees;
    (iview->Old).Angles.Pitch.Degrees = (iview->New).Angles.Pitch.Degrees;
    (iview->Old).Angles.Yaw.Degrees = dVar14;
  }
  dVar14 = (iview->Old).Pos.X;
  dVar19 = (iview->Old).Pos.Y;
  psVar6 = R_PointInSubsector(SUB84(dVar14 + 103079215104.0,0),SUB84(dVar19 + 103079215104.0,0));
  iVar5 = psVar6->sector->PortalGroup;
  dVar15 = (iview->New).Pos.X;
  dVar22 = (iview->New).Pos.Y;
  psVar6 = R_PointInSubsector(SUB84(dVar15 + 103079215104.0,0),SUB84(dVar22 + 103079215104.0,0));
  local_68 = (iview->Old).Angles.Yaw.Degrees;
  local_70 = (iview->New).Angles.Yaw.Degrees;
  if (cl_capfps.Value != false) {
    ViewPos.Z = (iview->New).Pos.Z;
    ViewPos.X = dVar15;
    ViewPos.Y = dVar22;
    ViewPath[0].X = dVar15;
    ViewPath[0].Y = dVar22;
    ViewPath[0].Z = ViewPos.Z;
    ViewPath[1].X = dVar15;
    ViewPath[1].Y = dVar22;
    ViewPath[1].Z = ViewPos.Z;
    goto LAB_00477f20;
  }
  iVar3 = psVar6->sector->PortalGroup;
  if ((dVar14 != dVar15) || (NAN(dVar14) || NAN(dVar15))) {
LAB_004779d7:
    if (InterpolationPath.Count != 0) {
      if (r_showviewer == false) {
        dVar19 = (iview->Old).Pos.Y;
        local_50 = (iview->Old).Pos.Z;
        local_58 = (iview->New).Pos.Z;
        dVar22 = (iview->New).Pos.Y;
        TArray<DVector3a,_DVector3a>::Grow(&InterpolationPath,1);
        pDVar7 = InterpolationPath.Array;
        uVar9 = (ulong)InterpolationPath.Count;
        InterpolationPath.Array[uVar9].pos.X = dVar15;
        pDVar7[uVar9].pos.Y = dVar22;
        pdVar2 = &pDVar7[uVar9].pos.Z;
        *pdVar2 = 0.0;
        pdVar2[1] = 0.0;
        dVar15 = 0.0;
        local_90 = 0.0;
        local_98 = 0.0;
        InterpolationPath.Count = InterpolationPath.Count + 1;
        uVar12 = (undefined4)((ulong)dVar14 >> 0x20);
        if (InterpolationPath.Count != 0) {
          uVar9 = 0;
          local_98 = 0.0;
          local_90 = 0.0;
          dVar15 = 0.0;
          do {
            iVar5 = (int)uVar9;
            pDVar7 = InterpolationPath.Array + (iVar5 - 1);
            dVar22 = dVar19;
            uVar13 = uVar12;
            uVar11 = SUB84(dVar14,0);
            if (iVar5 != 0) {
              dVar22 = (pDVar7->pos).X;
              uVar11 = SUB84(dVar22,0);
              uVar13 = (undefined4)((ulong)dVar22 >> 0x20);
              dVar22 = (pDVar7->pos).Y;
            }
            dVar16 = 0.0;
            if (iVar5 != 0) {
              dVar16 = (pDVar7->pos).Z;
            }
            dVar20 = InterpolationPath.Array[uVar9].pos.X - (double)CONCAT44(uVar13,uVar11);
            dVar22 = InterpolationPath.Array[uVar9].pos.Y - dVar22;
            dVar16 = InterpolationPath.Array[uVar9].pos.Z - dVar16;
            dVar16 = c_sqrt(dVar16 * dVar16 + dVar22 * dVar22 + dVar20 * dVar20);
            dVar22 = 0.0;
            if (iVar5 == 0) {
              dVar20 = 0.0;
            }
            else {
              dVar22 = (pDVar7->pos).Z;
              dVar20 = (pDVar7->angle).Degrees;
            }
            local_90 = local_90 + dVar20;
            dVar15 = dVar15 + dVar16;
            local_98 = local_98 + dVar22;
            uVar9 = (ulong)(iVar5 + 2U);
          } while (iVar5 + 2U < InterpolationPath.Count);
        }
        if (InterpolationPath.Count != 0) {
          uVar8 = 0;
          dVar16 = 0.0;
          dVar20 = 0.0;
          dVar22 = dVar15 * Frac;
          do {
            pDVar7 = InterpolationPath.Array + (uVar8 - 1);
            dVar18 = dVar19;
            uVar13 = uVar12;
            uVar11 = SUB84(dVar14,0);
            if (uVar8 != 0) {
              dVar18 = (pDVar7->pos).X;
              uVar11 = SUB84(dVar18,0);
              uVar13 = (undefined4)((ulong)dVar18 >> 0x20);
              dVar18 = (pDVar7->pos).Y;
            }
            dVar17 = 0.0;
            if (uVar8 != 0) {
              dVar17 = (pDVar7->pos).Z;
            }
            pDVar1 = InterpolationPath.Array + uVar8;
            dVar21 = InterpolationPath.Array[uVar8].pos.X - (double)CONCAT44(uVar13,uVar11);
            dVar18 = (pDVar1->pos).Y - dVar18;
            dVar17 = (pDVar1->pos).Z - dVar17;
            dVar17 = c_sqrt(dVar17 * dVar17 + dVar18 * dVar18 + dVar21 * dVar21);
            dVar18 = 0.0;
            if (uVar8 == 0) {
              dVar21 = 0.0;
            }
            else {
              dVar18 = (pDVar7->pos).Z;
              dVar21 = (pDVar7->angle).Degrees;
            }
            dVar20 = dVar20 + dVar21;
            dVar16 = dVar16 + dVar18;
            if (dVar22 < dVar17) {
              dVar21 = dVar19;
              dVar18 = dVar14;
              if (uVar8 != 0) {
                dVar18 = (pDVar7->pos).X;
                dVar21 = (pDVar7->pos).Y;
              }
              local_50 = local_50 + dVar16;
              local_58 = local_58 - (local_98 - dVar16);
              local_68 = local_68 + dVar20;
              local_70 = local_70 - (local_90 - dVar20);
              ViewPos.X = ((pDVar1->pos).X - dVar18) * (dVar22 / dVar17) + dVar18;
              ViewPos.Y = ((pDVar1->pos).Y - dVar21) * (dVar22 / dVar17) + dVar21;
              ViewPos.Z = (local_58 - local_50) * Frac + local_50;
              dVar18 = dVar22;
            }
            else {
              dVar18 = dVar22 - dVar17;
            }
          } while ((dVar17 <= dVar22) &&
                  (uVar8 = uVar8 + 2, dVar22 = dVar18, uVar8 < InterpolationPath.Count));
        }
        if (InterpolationPath.Count != 0) {
          InterpolationPath.Count = InterpolationPath.Count - 1;
        }
        ViewPath[0].Z = (iview->Old).Pos.Z;
        ViewPath[0].Y = (iview->Old).Pos.Y;
        ViewPath[0].X = (iview->Old).Pos.X;
        dVar22 = ((InterpolationPath.Array)->pos).X - ViewPath[0].X;
        dVar19 = ((InterpolationPath.Array)->pos).Y - ViewPath[0].Y;
        dVar14 = c_sqrt(dVar19 * dVar19 + dVar22 * dVar22);
        ViewPath[1].Z = ViewPath[0].Z;
        ViewPath[1].X = dVar22 * (dVar15 / dVar14) + ViewPath[0].X;
        ViewPath[1].Y = (dVar15 / dVar14) * dVar19 + ViewPath[0].Y;
      }
      goto LAB_00477f20;
    }
  }
  else {
    dVar16 = (iview->Old).Pos.Y;
    pdVar2 = &(iview->New).Pos.Y;
    if ((dVar16 != *pdVar2) || (NAN(dVar16) || NAN(*pdVar2))) goto LAB_004779d7;
  }
  dVar20 = 0.0;
  dVar16 = 0.0;
  if (iVar5 != iVar3) {
    iVar5 = iVar3 * Displacements.size + iVar5;
    dVar16 = Displacements.data.Array[iVar5].pos.X;
    dVar20 = Displacements.data.Array[iVar5].pos.Y;
  }
  dVar18 = (iview->Old).Pos.Z;
  ViewPath[0].Z = (iview->New).Pos.Z;
  ViewPos.X = ((dVar15 - dVar14) - dVar16) * Frac + dVar14;
  ViewPos.Y = ((dVar22 - dVar19) - dVar20) * Frac + dVar19;
  ViewPos.Z = (ViewPath[0].Z - dVar18) * Frac + dVar18;
  ViewPath[0].X = dVar15;
  ViewPath[0].Y = dVar22;
  ViewPath[1].X = dVar15;
  ViewPath[1].Y = dVar22;
  ViewPath[1].Z = ViewPath[0].Z;
LAB_00477f20:
  if ((((((player == (player_t *)0x0) || (((uint)player->cheats >> 0xe & 1) != 0)) ||
        (((long)&player[-0x91ab].ConversationNPCAngle >> 5) * -0x30c30c30c30c30c3 -
         (long)consoleplayer != 0)) ||
       (((APlayerPawn *)camera != player->mo || (demoplayback != false)))) ||
      (((dVar14 = (iview->New).Pos.X, dVar14 != (camera->__Pos).X ||
        ((NAN(dVar14) || NAN((camera->__Pos).X) || ((player->cheats & 0x1040U) != 0)))) ||
       (dVar14 = (iview->New).Pos.Y, pdVar2 = &(camera->__Pos).Y, dVar14 != *pdVar2)))) ||
     (((((NAN(dVar14) || NAN(*pdVar2) || (player->playerstate != '\0')) ||
        ((player->mo->super_AActor).reactiontime != 0)) ||
       (((NoInterpolateView != false || (paused != 0)) ||
        ((netgame == true && (cl_noprediction.Value != false)))))) || (LocalKeyboardTurner != false)
      ))) {
    dVar14 = (iview->Old).Angles.Pitch.Degrees;
    ViewPitch.Degrees =
         (double)SUB84(((double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar14) *
                                      11930464.711111112 + 6755399441055744.0,0) *
                        8.381903171539307e-08 * Frac + dVar14) * 11930464.711111112 +
                       6755399441055744.0,0) * 8.381903171539307e-08;
    iVar5 = SUB84(((double)SUB84((local_70 - local_68) * 11930464.711111112 + 6755399441055744.0,0)
                   * 8.381903171539307e-08 * Frac + local_68) * 11930464.711111112 +
                  6755399441055744.0,0);
    dVar14 = (iview->Old).Angles.Roll.Degrees;
    dVar14 = (double)SUB84(((iview->New).Angles.Roll.Degrees - dVar14) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08 * Frac + dVar14;
  }
  else {
    iVar5 = SUB84((local_70 + (double)((ulong)LocalViewAngle._2_2_ << 0x10) * 8.381903171539307e-08)
                  * 11930464.711111112 + 6755399441055744.0,0);
    dVar14 = 0.0;
    if (player->centering == false) {
      dVar14 = (double)(int)((uint)LocalViewPitch._2_2_ << 0x10) * 8.381903171539307e-08;
    }
    dVar15 = (double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar14) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08;
    dVar14 = (player->MinPitch).Degrees;
    dVar19 = (player->MaxPitch).Degrees;
    uVar9 = -(ulong)(dVar19 <= dVar15);
    uVar10 = -(ulong)(dVar14 < dVar15);
    ViewPitch.Degrees =
         (double)(~uVar10 & (ulong)dVar14 |
                 (uVar9 & (ulong)dVar19 | ~uVar9 & (ulong)dVar15) & uVar10);
    dVar14 = (iview->New).Angles.Roll.Degrees;
  }
  ViewAngle.Degrees = (double)iVar5 * 8.381903171539307e-08;
  ViewRoll.Degrees =
       (double)SUB84(dVar14 * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
  psVar6 = R_PointInSubsector(SUB84(ViewPos.X + 103079215104.0,0),
                              SUB84(ViewPos.Y + 103079215104.0,0));
  dVar14 = ViewPos.Z;
  pFVar4 = sectorPortals.Array;
  local_90 = ViewPos.X;
  local_98 = ViewPos.Y;
  viewsector = (sector_t *)psVar6->sector;
  if ((((sector_t_conflict *)viewsector)->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar9 = (ulong)((sector_t_conflict *)viewsector)->Portals[1];
    dVar19 = sectorPortals.Array[uVar9].mPlaneZ;
    if (dVar19 < ViewPos.Z) {
      do {
        local_90 = local_90 + pFVar4[uVar9].mDisplacement.X;
        local_98 = local_98 + pFVar4[uVar9].mDisplacement.Y;
        ViewPos.X = local_90;
        ViewPos.Y = local_98;
        psVar6 = R_PointInSubsector(SUB84(local_90 + 103079215104.0,0),
                                    SUB84(local_98 + 103079215104.0,0));
        viewsector = (sector_t *)psVar6->sector;
        if ((((sector_t_conflict *)viewsector)->planes[1].Flags & 0x1d0U) != 0x100) {
          return;
        }
        uVar9 = (ulong)((sector_t_conflict *)viewsector)->Portals[1];
      } while (pFVar4[uVar9].mPlaneZ <= dVar14 && dVar14 != pFVar4[uVar9].mPlaneZ);
      if (dVar19 < dVar14) {
        return;
      }
    }
  }
  dVar15 = ViewPos.Z;
  pFVar4 = sectorPortals.Array;
  uVar8 = viewsector->planes[0].Flags;
  dVar14 = ViewPos.X;
  dVar19 = ViewPos.Y;
  while (((uVar8 & 0x1d0) == 0x100 &&
         (uVar8 = ((sector_t_conflict *)viewsector)->Portals[0], dVar15 < pFVar4[uVar8].mPlaneZ))) {
    dVar14 = dVar14 + pFVar4[uVar8].mDisplacement.X;
    dVar19 = dVar19 + pFVar4[uVar8].mDisplacement.Y;
    ViewPos.X = dVar14;
    ViewPos.Y = dVar19;
    psVar6 = R_PointInSubsector(SUB84(dVar14 + 103079215104.0,0),SUB84(dVar19 + 103079215104.0,0));
    viewsector = (sector_t *)psVar6->sector;
    uVar8 = ((sector_t_conflict *)viewsector)->planes[0].Flags;
  }
  return;
}

Assistant:

void R_InterpolateView (player_t *player, double Frac, InterpolationViewer *iview)
{
	if (NoInterpolateView)
	{
		InterpolationPath.Clear();
		NoInterpolateView = false;
		iview->Old = iview->New;
	}
	int oldgroup = R_PointInSubsector(iview->Old.Pos)->sector->PortalGroup;
	int newgroup = R_PointInSubsector(iview->New.Pos)->sector->PortalGroup;

	DAngle oviewangle = iview->Old.Angles.Yaw;
	DAngle nviewangle = iview->New.Angles.Yaw;
	if (!cl_capfps)
	{
		if ((iview->Old.Pos.X != iview->New.Pos.X || iview->Old.Pos.Y != iview->New.Pos.Y) && InterpolationPath.Size() > 0)
		{
			DVector3 view = iview->New.Pos;

			// Interpolating through line portals is a messy affair.
			// What needs be done is to store the portal transitions of the camera actor as waypoints
			// and then find out on which part of the path the current view lies.
			// Needless to say, this doesn't work for chasecam mode.
			if (!r_showviewer)
			{
				double pathlen = 0;
				double zdiff = 0;
				double totalzdiff = 0;
				DAngle adiff = 0.;
				DAngle totaladiff = 0.;
				double oviewz = iview->Old.Pos.Z;
				double nviewz = iview->New.Pos.Z;
				DVector3a oldpos = { { iview->Old.Pos.X, iview->Old.Pos.Y, 0 }, 0. };
				DVector3a newpos = { { iview->New.Pos.X, iview->New.Pos.Y, 0 }, 0. };
				InterpolationPath.Push(newpos);	// add this to  the array to simplify the loops below

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					pathlen += (end.pos - start.pos).Length();
					totalzdiff += start.pos.Z;
					totaladiff += start.angle;
				}
				double interpolatedlen = Frac * pathlen;

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					double fraglen = (end.pos - start.pos).Length();
					zdiff += start.pos.Z;
					adiff += start.angle;
					if (fraglen <= interpolatedlen)
					{
						interpolatedlen -= fraglen;
					}
					else
					{
						double fragfrac = interpolatedlen / fraglen;
						oviewz += zdiff;
						nviewz -= totalzdiff - zdiff;
						oviewangle += adiff;
						nviewangle -= totaladiff - adiff;
						DVector2 viewpos = start.pos + (fragfrac * (end.pos - start.pos));
						ViewPos = { viewpos, oviewz + Frac * (nviewz - oviewz) };
						break;
					}
				}
				InterpolationPath.Pop();
				ViewPath[0] = iview->Old.Pos;
				ViewPath[1] = ViewPath[0] + (InterpolationPath[0].pos - ViewPath[0]).XY().MakeResize(pathlen);
			}
		}
		else
		{
			DVector2 disp = Displacements.getOffset(oldgroup, newgroup);
			ViewPos = iview->Old.Pos + (iview->New.Pos - iview->Old.Pos - disp) * Frac;
			ViewPath[0] = ViewPath[1] = iview->New.Pos;
		}
	}
	else
	{
		ViewPos = iview->New.Pos;
		ViewPath[0] = ViewPath[1] = iview->New.Pos;
	}
	if (player != NULL &&
		!(player->cheats & CF_INTERPVIEW) &&
		player - players == consoleplayer &&
		camera == player->mo &&
		!demoplayback &&
		iview->New.Pos.X == camera->X() &&
		iview->New.Pos.Y == camera->Y() && 
		!(player->cheats & (CF_TOTALLYFROZEN|CF_FROZEN)) &&
		player->playerstate == PST_LIVE &&
		player->mo->reactiontime == 0 &&
		!NoInterpolateView &&
		!paused &&
		(!netgame || !cl_noprediction) &&
		!LocalKeyboardTurner)
	{
		ViewAngle = (nviewangle + AngleToFloat(LocalViewAngle & 0xFFFF0000)).Normalized180();
		DAngle delta = player->centering ? DAngle(0.) : AngleToFloat(int(LocalViewPitch & 0xFFFF0000));
		ViewPitch = clamp<DAngle>((iview->New.Angles.Pitch - delta).Normalized180(), player->MinPitch, player->MaxPitch);
		ViewRoll = iview->New.Angles.Roll.Normalized180();
	}
	else
	{
		ViewPitch = (iview->Old.Angles.Pitch + deltaangle(iview->Old.Angles.Pitch, iview->New.Angles.Pitch) * Frac).Normalized180();
		ViewAngle = (oviewangle + deltaangle(oviewangle, nviewangle) * Frac).Normalized180();
		ViewRoll = (iview->Old.Angles.Roll + deltaangle(iview->Old.Angles.Roll, iview->New.Angles.Roll) * Frac).Normalized180();
	}
	
	// Due to interpolation this is not necessarily the same as the sector the camera is in.
	viewsector = R_PointInSubsector(ViewPos)->sector;
	bool moved = false;
	while (!viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		if (ViewPos.Z > viewsector->GetPortalPlaneZ(sector_t::ceiling))
		{
			ViewPos += viewsector->GetPortalDisplacement(sector_t::ceiling);
			viewsector = R_PointInSubsector(ViewPos)->sector;
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!viewsector->PortalBlocksMovement(sector_t::floor))
		{
			if (ViewPos.Z < viewsector->GetPortalPlaneZ(sector_t::floor))
			{
				ViewPos += viewsector->GetPortalDisplacement(sector_t::floor);
				viewsector = R_PointInSubsector(ViewPos)->sector;
				moved = true;
			}
			else break;
		}
	}
}